

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void inspect_serialized_object
               (FILE *serialized_bytes,bool *is_isotree_model,bool *is_compatible,
               bool *has_combined_objects,bool *has_IsoForest,bool *has_ExtIsoForest,
               bool *has_Imputer,bool *has_Indexer,bool *has_metadata,size_t *size_metadata)

{
  FILE *local_8;
  
  local_8 = serialized_bytes;
  inspect_serialized_object<_IO_FILE*>
            (&local_8,is_isotree_model,is_compatible,has_combined_objects,has_IsoForest,
             has_ExtIsoForest,has_Imputer,has_Indexer,has_metadata,size_metadata);
  return;
}

Assistant:

void inspect_serialized_object
(
    FILE *serialized_bytes,
    bool &is_isotree_model,
    bool &is_compatible,
    bool &has_combined_objects,
    bool &has_IsoForest,
    bool &has_ExtIsoForest,
    bool &has_Imputer,
    bool &has_Indexer,
    bool &has_metadata,
    size_t &size_metadata
)
{
    FILE *in = serialized_bytes;
    inspect_serialized_object<FILE*>(
        in,
        is_isotree_model,
        is_compatible,
        has_combined_objects,
        has_IsoForest,
        has_ExtIsoForest,
        has_Imputer,
        has_Indexer,
        has_metadata,
        size_metadata
    );
}